

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ThreadSafeArena::CleanupList(ThreadSafeArena *this)

{
  __atomic_base<long> _Var1;
  SerialArenaChunk *pSVar2;
  SerialArena *this_00;
  StringBlock *string_block;
  Chunk *pCVar3;
  size_t sVar4;
  __atomic_base<long> this_01;
  SerialArenaChunk *this_02;
  Chunk *pCVar5;
  ulong uVar6;
  void *pvVar7;
  GetDeallocator GVar8;
  SerialArena *arena;
  ThreadSafeArena *pTVar9;
  GetDeallocator deallocator;
  long lVar10;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar11;
  SizedPtr SVar12;
  undefined1 auStack_78 [24];
  __atomic_base<long> _Stack_60;
  
  this_01._M_i = (__int_type_conflict1)(this->head_)._M_b._M_p;
  do {
    do {
      if ((this_01._M_i & 7U) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                      ,0x1fe,
                      "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                     );
      }
      if (*(int *)(this_01._M_i + 8) == 0) {
        cleanup::ChunkList::Cleanup(&(this->first_arena_).cleanup_list_,&this->first_arena_);
        return;
      }
      _Var1._M_i = *this_01._M_i;
      SVar11 = SerialArenaChunk::arenas((SerialArenaChunk *)this_01._M_i);
      this_01._M_i = _Var1._M_i;
    } while (SVar11.len_ == 0);
    lVar10 = SVar11.len_ << 3;
    do {
      arena = *(SerialArena **)((long)&SVar11.ptr_[-1]._M_b._M_p + lVar10);
      if (arena == (SerialArena *)0x0) {
        pTVar9 = (ThreadSafeArena *)&stack0xffffffffffffffd0;
        CleanupList(pTVar9);
        uVar6 = (pTVar9->alloc_policy_).policy_ & 0xfffffffffffffff8;
        if (uVar6 == 0) {
          deallocator.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
        }
        else {
          deallocator.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar6 + 0x18);
        }
        _Stack_60._M_i = _Var1._M_i;
        this_02 = (pTVar9->head_)._M_b._M_p;
        auStack_78._16_8_ = this;
        goto joined_r0x001ca374;
      }
      cleanup::ChunkList::Cleanup(&arena->cleanup_list_,arena);
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
  } while( true );
joined_r0x001ca374:
  if (((ulong)this_02 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long>, OffsetSeq = std::integer_sequence<unsigned long, 0>, N = 0UL, Char = const char]"
                 );
  }
  if (*(int *)(this_02 + 8) == 0) {
    SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
              (&pTVar9->first_arena_,deallocator);
    return;
  }
  pSVar2 = *(SerialArenaChunk **)this_02;
  SVar11 = SerialArenaChunk::arenas(this_02);
  if (SVar11.len_ != 0) {
    lVar10 = SVar11.len_ << 3;
    do {
      this_00 = *(SerialArena **)((long)&SVar11.ptr_[-1]._M_b._M_p + lVar10);
      if (this_00 == (SerialArena *)0x0) {
        Free((ThreadSafeArena *)auStack_78);
        GVar8.dealloc_ = (_func_void_void_ptr_size_t *)arena;
LAB_001ca431:
        pTVar9 = (ThreadSafeArena *)auStack_78;
        Free(pTVar9);
        string_block = (StringBlock *)(pTVar9->first_arena_).limit_;
        if (string_block != (StringBlock *)0x0) {
          SerialArena::FreeStringBlocks(string_block,(size_t)(pTVar9->first_arena_).prefetch_ptr_);
        }
        pCVar3 = (pTVar9->first_arena_).cleanup_list_.head_;
        sVar4 = pCVar3->size;
        for (pCVar5 = pCVar3->next; pCVar5 != (Chunk *)0x0; pCVar5 = pCVar5->next) {
          if ((SerialArena *)GVar8.dealloc_ == (SerialArena *)0x0) {
            operator_delete(pCVar3,sVar4);
          }
          else {
            (*GVar8.dealloc_)();
          }
          sVar4 = pCVar5->size;
          pCVar3 = pCVar5;
        }
        return;
      }
      GVar8.dealloc_ = deallocator.dealloc_;
      SVar12 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                         (this_00,deallocator);
      arena = (SerialArena *)SVar12.n;
      pvVar7 = SVar12.p;
      if (pvVar7 == (void *)0x0) goto LAB_001ca431;
      if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
        operator_delete(pvVar7,(ulong)arena);
      }
      else {
        (*deallocator.dealloc_)(pvVar7,(size_t)arena);
      }
      lVar10 = lVar10 + -8;
    } while (lVar10 != 0);
  }
  arena = (SerialArena *)((ulong)*(uint *)(this_02 + 8) * 0x10 + 0x10);
  operator_delete(this_02,(ulong)arena);
  this_02 = pSVar2;
  goto joined_r0x001ca374;
}

Assistant:

void ThreadSafeArena::CleanupList() {
#ifdef PROTOBUF_ASAN
  UnpoisonAllArenaBlocks();
#endif

  WalkSerialArenaChunk([](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last.
    // Destroying in reverse-order to the construction is often assumed by users
    // and required not to break inter-object dependencies. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      serial->CleanupList();
    }
  });
  // First arena must be cleaned up last. (b/247560530)
  first_arena_.CleanupList();
}